

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

uint encodeRex(uchar *stream,bool operand64Bit,x86Reg reg,x86Reg index,x86Reg base)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uchar code;
  x86Reg base_local;
  x86Reg index_local;
  x86Reg reg_local;
  bool operand64Bit_local;
  uchar *stream_local;
  
  bVar1 = 0;
  if (operand64Bit) {
    bVar1 = 8;
  }
  bVar2 = 0;
  if (8 < (int)reg) {
    bVar2 = 4;
  }
  bVar3 = 0;
  if (8 < (int)index) {
    bVar3 = 2;
  }
  bVar1 = bVar1 | bVar2 | bVar3 | 8 < (int)base;
  if (bVar1 != 0) {
    *stream = bVar1 | 0x40;
  }
  stream_local._4_4_ = (uint)(bVar1 != 0);
  return stream_local._4_4_;
}

Assistant:

unsigned encodeRex(unsigned char* stream, bool operand64Bit, x86Reg reg, x86Reg index, x86Reg base)
{
	unsigned char code = (operand64Bit ? 0x08 : 0x00) | (reg >= rR8 ? 0x04 : 0x00) | (index >= rR8 ? 0x02 : 0x00) | (base >= rR8 ? 0x01 : 0x00);

	if(code)
	{
		assert(sizeof(void*) == 8);

		*stream = 0x40 | code;
		return 1;
	}

	return 0;
}